

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O1

bool __thiscall cppjieba::HMMModel::GetLine(HMMModel *this,ifstream *ifile,string *line)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  bool bVar4;
  bool bVar5;
  long *local_50;
  string *local_48;
  long local_40 [2];
  
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)ifile + -0x18) + (char)ifile);
  piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)ifile,(string *)line,cVar1);
  bVar4 = ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0;
  if (bVar4) {
    do {
      limonp::Trim(line);
      if (line->_M_string_length != 0) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"#","");
        if ((string *)line->_M_string_length < local_48) {
          bVar5 = false;
        }
        else {
          iVar2 = std::__cxx11::string::compare((ulong)line,0,local_48);
          bVar5 = iVar2 == 0;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (!bVar5) {
          return bVar4;
        }
      }
      cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)ifile + -0x18) + (char)ifile);
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)ifile,(string *)line,cVar1);
      bVar4 = ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool GetLine(ifstream& ifile, string& line) {
    while (getline(ifile, line)) {
      Trim(line);
      if (line.empty()) {
        continue;
      }
      if (StartsWith(line, "#")) {
        continue;
      }
      return true;
    }
    return false;
  }